

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::QWizard(QWizard *this,QWidget *parent,WindowFlags flags)

{
  QDialogPrivate *this_00;
  long lVar1;
  
  this_00 = (QDialogPrivate *)operator_new(0x4e0);
  QDialogPrivate::QDialogPrivate(this_00);
  *(undefined ***)&this_00->super_QWidgetPrivate = &PTR__QWizardPrivate_00806380;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x8 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x10 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x18 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x28 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x30 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x40 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x48 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.field_0x50 = 0;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x58 = 0xffffffff;
  this_00[1].super_QWidgetPrivate.field_0x5c = 0;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x60 = 0xffffffff;
  *(undefined2 *)&this_00[1].super_QWidgetPrivate.field_0x64 = 0;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x68 = 0xffffffff;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x6c = 0xffffffff;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x70 = 0xffffffff;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x74 = 0xffffffff;
  *(undefined4 *)
   &this_00[1].super_QWidgetPrivate.extra._M_t.
    super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = 0xffffffff;
  *(undefined4 *)
   ((long)&this_00[1].super_QWidgetPrivate.extra._M_t.
           super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false> + 4) = 0xffffffff;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.focus_next = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_QWidgetPrivate.focus_next + 4) = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_QWidgetPrivate.focus_next + 4) = 0xffffffff;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.focus_prev = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_QWidgetPrivate.focus_prev + 4) = 0xffffffff;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.focus_child = 0xffffffff;
  *(undefined8 *)((long)&this_00[1].super_QWidgetPrivate.focus_child + 4) = 0;
  *(undefined2 *)((long)&this_00[1].super_QWidgetPrivate.layout + 4) = 0;
  this_00[1].super_QWidgetPrivate.needsFlush = (QRegion *)0x0;
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.redirectDev = 0;
  this_00[1].super_QWidgetPrivate.widgetItem = (QWidgetItemV2 *)0x0;
  *(undefined1 *)&this_00[1].super_QWidgetPrivate.extraPaintEngine = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.imHints = 0;
  this_00[1].super_QWidgetPrivate.polished = (QMetaObject *)0x0;
  this_00[1].super_QWidgetPrivate.graphicsEffect = (QGraphicsEffect *)0x0;
  this_00[1].super_QWidgetPrivate.opaqueChildren.d = (QRegionData *)0x200000002;
  lVar1 = 0x3c0;
  do {
    QPixmap::QPixmap((QPixmap *)(&(this_00->super_QWidgetPrivate).super_QObjectPrivate + lVar1));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x420);
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.data.fnt = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.data.field_0x40 = 0;
  this_00[1].super_QWidgetPrivate.data.pal.d = (QPalettePrivate *)0x0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.data.pal.currentGroup = 0;
  this_00[1].super_QWidgetPrivate.data.crect.y1 = 0;
  this_00[1].super_QWidgetPrivate.data.crect.x2 = 0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.data.crect.y2 = 0;
  this_00[1].super_QWidgetPrivate.data.widget_attributes = 0;
  this_00[1].super_QWidgetPrivate.data.window_flags = (QFlagsStorageHelper<Qt::WindowType,_4>)0x0;
  *(undefined8 *)&this_00[1].super_QWidgetPrivate.data.field_0x10 = 0;
  this_00[1].super_QWidgetPrivate.hd = (HANDLE)0x0;
  this_00[1].super_QWidgetPrivate.data.winid = 0;
  this_00[1].super_QWidgetPrivate.leftmargin = 0;
  this_00[1].super_QWidgetPrivate.topmargin = 0;
  this_00[1].super_QWidgetPrivate.rightmargin = 0;
  this_00[1].super_QWidgetPrivate.bottommargin = 0;
  this_00[1].super_QWidgetPrivate.leftLayoutItemMargin = '\0';
  this_00[1].super_QWidgetPrivate.topLayoutItemMargin = '\0';
  this_00[1].super_QWidgetPrivate.rightLayoutItemMargin = '\0';
  this_00[1].super_QWidgetPrivate.bottomLayoutItemMargin = '\0';
  *(undefined4 *)&this_00[1].super_QWidgetPrivate.field_0x1a4 = 0;
  this_00[1].super_QWidgetPrivate.directPaletteResolveMask = 0;
  this_00[1].super_QWidgetPrivate.inheritedPaletteResolveMask = 0;
  this_00[1].super_QWidgetPrivate.data.wrect.x1 = 0xffffff;
  this_00[1].super_QWidgetPrivate.data.wrect.y1 = 0xffffff;
  QDialog::QDialog(&this->super_QDialog,this_00,parent,flags);
  *(undefined ***)&(this->super_QDialog).super_QWidget = &PTR_metaObject_008056f8;
  *(undefined ***)&(this->super_QDialog).super_QWidget.super_QPaintDevice = &PTR__QWizard_008058f0;
  QWizardPrivate::init
            (*(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QWizard::QWizard(QWidget *parent, Qt::WindowFlags flags)
    : QDialog(*new QWizardPrivate, parent, flags)
{
    Q_D(QWizard);
    d->init();
}